

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_invalidate_phys_range_arm(uc_struct_conflict1 *uc,ram_addr_t start,ram_addr_t end)

{
  page_collection *set;
  PageDesc *p;
  PageDesc *local_48;
  tb_page_addr_t bound;
  PageDesc *pd;
  tb_page_addr_t next;
  page_collection *pages;
  ram_addr_t end_local;
  ram_addr_t start_local;
  uc_struct_conflict1 *uc_local;
  
  set = page_collection_lock_arm(uc,start,end);
  pd = (PageDesc *)((start & (long)uc->init_target_page->mask) + (long)-uc->init_target_page->mask);
  end_local = start;
  while (0 < (long)(end - end_local)) {
    p = page_find(uc,end_local >> ((byte)uc->init_target_page->bits & 0x3f));
    local_48 = (PageDesc *)end;
    if (pd < end) {
      local_48 = pd;
    }
    if (p != (PageDesc *)0x0) {
      tb_invalidate_phys_page_range__locked(uc,set,p,end_local,(tb_page_addr_t)local_48,0);
    }
    end_local = (ram_addr_t)pd;
    pd = (PageDesc *)((long)&pd->first_tb + (long)-uc->init_target_page->mask);
  }
  page_collection_unlock_arm(set);
  return;
}

Assistant:

void tb_invalidate_phys_range(struct uc_struct *uc, ram_addr_t start, ram_addr_t end)
{
    struct page_collection *pages;
    tb_page_addr_t next;

    assert_memory_lock();

    pages = page_collection_lock(uc, start, end);
    for (next = (start & TARGET_PAGE_MASK) + TARGET_PAGE_SIZE;
         //start < end; Unicorn: Fix possible wrap around
         (intptr_t)(end - start) > 0;
         start = next, next += TARGET_PAGE_SIZE) {
        PageDesc *pd = page_find(uc, start >> TARGET_PAGE_BITS);
        tb_page_addr_t bound = MIN(next, end);

        if (pd == NULL) {
            continue;
        }
        tb_invalidate_phys_page_range__locked(uc, pages, pd, start, bound, 0);
    }
    page_collection_unlock(pages);
}